

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  HttpOutputStream *this_01;
  _func_int **pp_Var1;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> handle;
  HttpOutputStream *pHVar3;
  undefined4 in_register_00000034;
  HttpEntityBodyWriter *this_02;
  PromiseAwaiter<void> *__return_storage_ptr__;
  ArrayPtr<const_unsigned_char> buffer;
  Fault f;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  Fault local_60;
  DebugComparison<unsigned_long,_unsigned_long_&> local_58;
  
  this_02 = (HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd);
  handle._M_fr_ptr = operator_new(0x408);
  *(code **)handle._M_fr_ptr = write;
  *(code **)((long)handle._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x3f8) = this_02;
  local_58.left = 0x4d3fd6;
  local_58.right = (unsigned_long *)0x4a33ea;
  local_58.op.content.ptr = (char *)0x11000009a8;
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9a8;
  location.columnNumber = 0x11;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  if (__n != 0) {
    local_58.right = (unsigned_long *)(this_02 + 1);
    pp_Var1 = this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
    local_58.op.content.ptr = " <= ";
    local_58.op.content.size_ = 5;
    local_58.result = pp_Var1 >= __n;
    local_58.left = __n;
    if (pp_Var1 < __n) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[25]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9aa,FAILED,"buffer.size() <= length","_kjCondition,\"overwrote Content-Length\""
                 ,&local_58,(char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)((long)pp_Var1 - __n)
    ;
    pHVar3 = HttpEntityBodyWriter::getInner(this_02);
    this_01 = (HttpOutputStream *)((long)handle._M_fr_ptr + 0x3f0);
    buffer.size_ = (size_t)__buf;
    buffer.ptr = (uchar *)pHVar3;
    HttpOutputStream::writeBodyData(this_01,buffer);
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x400) = 0;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar2) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    if ((*(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x3f8))[1].super_AsyncOutputStream.
        _vptr_AsyncOutputStream == (_func_int **)0x0) {
      HttpEntityBodyWriter::doneWriting(*(HttpEntityBodyWriter **)((long)handle._M_fr_ptr + 0x3f8));
    }
  }
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x400) = 1;
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) co_return;
    KJ_REQUIRE(buffer.size() <= length, "overwrote Content-Length");
    length -= buffer.size();

    co_await getInner().writeBodyData(buffer);
    if (length == 0) doneWriting();
  }